

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void wasm_trap_message(wasm_trap_t *trap,wasm_message_t *out)

{
  if (trap == (wasm_trap_t *)0x0) {
    __assert_fail("trap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0x246,"void wasm_trap_message(const wasm_trap_t *, wasm_message_t *)");
  }
  if (((trap->super_wasm_ref_t).I.obj_)->kind_ == Trap) {
    wasm_trap_message_cold_1();
    return;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h",
                0x4e,
                "Derived *wabt::cast(Base *) [Derived = wabt::interp::Trap, Base = wabt::interp::Object]"
               );
}

Assistant:

void wasm_trap_message(const wasm_trap_t* trap, own wasm_message_t* out) {
  assert(trap);
  *out = FromString(trap->As<Trap>()->message());
}